

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STLReader.cc
# Opt level: O0

void OpenMesh::IO::trimStdString(string *_string)

{
  string local_40 [32];
  long local_20;
  size_t end;
  size_t start;
  string *_string_local;
  
  start = (size_t)_string;
  end = std::__cxx11::string::find_first_not_of((char *)_string,0x36f3d3);
  local_20 = std::__cxx11::string::find_last_not_of((char *)start,0x36f3d3);
  if ((end == 0xffffffffffffffff) || (local_20 == -1)) {
    std::__cxx11::string::operator=((string *)start,"");
  }
  else {
    std::__cxx11::string::substr((ulong)local_40,start);
    std::__cxx11::string::operator=((string *)start,local_40);
    std::__cxx11::string::~string(local_40);
  }
  return;
}

Assistant:

void trimStdString( std::string& _string) {
  // Trim Both leading and trailing spaces

  size_t start = _string.find_first_not_of(" \t\r\n");
  size_t end   = _string.find_last_not_of(" \t\r\n");

  if(( std::string::npos == start ) || ( std::string::npos == end))
    _string = "";
  else
    _string = _string.substr( start, end-start+1 );
}